

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYRef<signed_char>,_ImPlot::TransformerLinLog>
                 *this,GetterXsYs<signed_char> *getter1,GetterXsYRef<signed_char> *getter2,
                TransformerLinLog *transformer,ImU32 col)

{
  double dVar1;
  ImVec2 IVar2;
  char cVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  GetterXsYRef<signed_char> *pGVar6;
  TransformerLinLog *pTVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar4 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar4 < getter2->Count) {
    iVar12 = iVar4;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  lVar13 = (long)((getter1->Offset % iVar4 + iVar4) % iVar4) * (long)getter1->Stride;
  cVar3 = getter1->Xs[lVar13];
  dVar10 = log10((double)(int)getter1->Ys[lVar13] /
                 GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
  iVar4 = transformer->YAxis;
  pIVar5 = pIVar11->CurrentPlot;
  dVar1 = pIVar5->YAxis[iVar4].Range.Min;
  IVar2 = pIVar11->PixelRange[iVar4].Min;
  IVar8.y = (float)(pIVar11->My[iVar4] *
                    (((double)(float)(dVar10 / pIVar11->LogDenY[iVar4]) *
                      (pIVar5->YAxis[iVar4].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  IVar8.x = (float)(pIVar11->Mx * ((double)(int)cVar3 - (pIVar5->XAxis).Range.Min) + (double)IVar2.x
                   );
  this->P11 = IVar8;
  pIVar11 = GImPlot;
  pGVar6 = this->Getter2;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  cVar3 = pGVar6->Xs[(long)((pGVar6->Offset % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride];
  dVar10 = log10(pGVar6->YRef / GImPlot->CurrentPlot->YAxis[pTVar7->YAxis].Range.Min);
  iVar4 = pTVar7->YAxis;
  pIVar5 = pIVar11->CurrentPlot;
  dVar1 = pIVar5->YAxis[iVar4].Range.Min;
  IVar2 = pIVar11->PixelRange[iVar4].Min;
  IVar9.y = (float)(pIVar11->My[iVar4] *
                    (((double)(float)(dVar10 / pIVar11->LogDenY[iVar4]) *
                      (pIVar5->YAxis[iVar4].Range.Max - dVar1) + dVar1) - dVar1) + (double)IVar2.y);
  IVar9.x = (float)(pIVar11->Mx * ((double)(int)cVar3 - (pIVar5->XAxis).Range.Min) + (double)IVar2.x
                   );
  this->P12 = IVar9;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }